

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementBeamIGA.h
# Opt level: O1

void __thiscall
chrono::fea::ChElementBeamIGA::GetStateBlock(ChElementBeamIGA *this,ChVectorDynamic<> *mD)

{
  double *pdVar1;
  long lVar2;
  pointer psVar3;
  pointer psVar4;
  element_type *peVar5;
  double *pdVar6;
  ulong uVar7;
  double *pdVar8;
  ulong uVar9;
  Index index;
  ulong uVar10;
  Index index_1;
  pointer psVar11;
  
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            (&mD->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,
             (long)(((ulong)((long)(this->nodes).
                                   super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(this->nodes).
                                  super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start) >> 4) * 0x700000000) >>
             0x20);
  psVar11 = (this->nodes).
            super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((this->nodes).
      super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != psVar11) {
    pdVar1 = (mD->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
    lVar2 = (mD->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
    psVar3 = (this->nodes).
             super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    psVar4 = (this->nodes).
             super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pdVar8 = pdVar1 + 3;
    uVar9 = 0;
    pdVar6 = pdVar1;
    do {
      if (lVar2 + -3 < (long)(uVar9 * 7)) {
LAB_006a408a:
        __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                      ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,
                      "Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Matrix<double, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
                     );
      }
      uVar10 = 3;
      if ((((ulong)(pdVar1 + uVar9 * 7) & 7) == 0) &&
         (uVar10 = (ulong)(-((uint)((ulong)(pdVar1 + uVar9 * 7) >> 3) & 0x1fffffff) & 7), 2 < uVar10
         )) {
        uVar10 = 3;
      }
      peVar5 = psVar11[uVar9].
               super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (uVar10 != 0) {
        uVar7 = 0;
        do {
          pdVar6[uVar7] = *(double *)(&(peVar5->super_ChNodeFEAbase).field_0x20 + uVar7 * 8);
          uVar7 = uVar7 + 1;
        } while (uVar10 != uVar7);
      }
      if (uVar10 < 3) {
        do {
          pdVar6[uVar10] = *(double *)(&(peVar5->super_ChNodeFEAbase).field_0x20 + uVar10 * 8);
          uVar10 = uVar10 + 1;
        } while (uVar10 != 3);
      }
      if (lVar2 + -4 < (long)(uVar9 * 7 + 3)) goto LAB_006a408a;
      uVar10 = 4;
      if ((((ulong)(pdVar1 + uVar9 * 7 + 3) & 7) == 0) &&
         (uVar10 = (ulong)(-((uint)((ulong)(pdVar1 + uVar9 * 7 + 3) >> 3) & 0x1fffffff) & 7),
         3 < uVar10)) {
        uVar10 = 4;
      }
      peVar5 = psVar3[uVar9].
               super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (uVar10 != 0) {
        uVar7 = 0;
        do {
          pdVar8[uVar7] = *(double *)(&peVar5->field_0x38 + uVar7 * 8);
          uVar7 = uVar7 + 1;
        } while (uVar10 != uVar7);
      }
      if (uVar10 < 4) {
        do {
          pdVar8[uVar10] = *(double *)(&peVar5->field_0x38 + uVar10 * 8);
          uVar10 = uVar10 + 1;
        } while (uVar10 != 4);
      }
      uVar9 = uVar9 + 1;
      pdVar6 = pdVar6 + 7;
      pdVar8 = pdVar8 + 7;
      psVar11 = psVar3;
    } while (uVar9 < (ulong)((long)psVar4 - (long)psVar3 >> 4));
  }
  return;
}

Assistant:

virtual void GetStateBlock(ChVectorDynamic<>& mD) override {
        mD.resize((int)this->nodes.size() * 7);

        for (int i = 0; i < nodes.size(); ++i) {
            mD.segment(i * 7 + 0, 3) = nodes[i]->coord.pos.eigen();
            mD.segment(i * 7 + 3, 4) = nodes[i]->coord.rot.eigen();
        }
    }